

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_epoll.c
# Opt level: O3

void test_createloop_epoll_eventloop_register_read_fails(void)

{
  cio_error cVar1;
  _func_int_int_int_int_epoll_event_ptr *epoll_ctrl_fakes [2];
  cio_eventloop loop;
  _func_int_int_int_int_epoll_event_ptr *local_508;
  code *pcStack_500;
  cio_eventloop local_4f0;
  
  epoll_ctl_fake.custom_fake_seq = &local_508;
  local_508 = epoll_ctl_save;
  pcStack_500 = epoll_ctl_fail;
  epoll_ctl_fake.custom_fake_seq_len = 2;
  memset(&local_4f0,0,0x4e8);
  cVar1 = cio_eventloop_init(&local_4f0);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (1,(ulong)epoll_create1_fake.call_count,"epoll_create1 was not called",0x16e,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)eventfd_fake.call_count,"eventfd was not called",0x16f,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (3,(ulong)epoll_ctl_fake.call_count,"epoll_ctl was not called",0x170,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (2,(ulong)close_fake.call_count,
               "close() was not called twice (for epoll fd and stop event fd)",0x171,
               UNITY_DISPLAY_STYLE_INT);
    return;
  }
  UnityFail("eventloop_init did not fail",0x16d);
}

Assistant:

static void test_createloop_epoll_eventloop_register_read_fails(void)
{
	int (*epoll_ctrl_fakes[])(int, int, int, struct epoll_event *) = {epoll_ctl_save, epoll_ctl_fail};
	SET_CUSTOM_FAKE_SEQ(epoll_ctl, epoll_ctrl_fakes, ARRAY_SIZE(epoll_ctrl_fakes))

	struct cio_eventloop loop = {0};
	enum cio_error err = cio_eventloop_init(&loop);
	TEST_ASSERT_NOT_EQUAL_MESSAGE(CIO_SUCCESS, err, "eventloop_init did not fail");
	TEST_ASSERT_EQUAL_MESSAGE(1, epoll_create1_fake.call_count, "epoll_create1 was not called");
	TEST_ASSERT_EQUAL_MESSAGE(1, eventfd_fake.call_count, "eventfd was not called");
	TEST_ASSERT_EQUAL_MESSAGE(3, epoll_ctl_fake.call_count, "epoll_ctl was not called");
	TEST_ASSERT_EQUAL_MESSAGE(2, close_fake.call_count, "close() was not called twice (for epoll fd and stop event fd)");
}